

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O2

unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true> __thiscall
duckdb::FSSTStorage::StringInitScan(FSSTStorage *this,ColumnSegment *segment)

{
  duckdb_fsst_decoder_t *decoder_out;
  element_type *peVar1;
  bool bVar2;
  uint32_t uVar3;
  BlockManager *this_00;
  idx_t iVar4;
  BufferManager *pBVar5;
  pointer pFVar6;
  data_ptr_t pdVar7;
  idx_t string_block_limit;
  __uniq_ptr_impl<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>_> local_50;
  BufferHandle local_48;
  ulong local_30;
  
  this_00 = ColumnSegment::GetBlockManager(segment);
  iVar4 = BlockManager::GetBlockSize(this_00);
  local_30 = iVar4 >> 2 & 0xfffffffffffffff8;
  if (0xfff < local_30) {
    local_30 = 0x1000;
  }
  make_uniq<duckdb::FSSTScanState,unsigned_long&>((duckdb *)&local_50,&local_30);
  pBVar5 = BufferManager::GetBufferManager(segment->db);
  (*pBVar5->_vptr_BufferManager[7])(&local_48,pBVar5,&segment->block);
  pFVar6 = unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>::
           operator->((unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>
                       *)&local_50);
  BufferHandle::operator=(&(pFVar6->super_StringScanState).handle,&local_48);
  BufferHandle::~BufferHandle(&local_48);
  pFVar6 = unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>::
           operator->((unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>
                       *)&local_50);
  pdVar7 = BufferHandle::Ptr(&(pFVar6->super_StringScanState).handle);
  iVar4 = segment->offset;
  make_shared_ptr<duckdb_fsst_decoder_t>();
  pFVar6 = unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>::
           operator->((unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>
                       *)&local_50);
  shared_ptr<void,_true>::operator=<duckdb_fsst_decoder_t,_0>
            (&pFVar6->duckdb_fsst_decoder,(shared_ptr<duckdb_fsst_decoder_t,_true> *)&local_48);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.handle.internal.
              super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pFVar6 = unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>::
           operator->((unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>
                       *)&local_50);
  decoder_out = (duckdb_fsst_decoder_t *)
                (pFVar6->duckdb_fsst_decoder).internal.
                super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pFVar6 = unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>::
           operator->((unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>
                       *)&local_50);
  bVar2 = ParseFSSTSegmentHeader(pdVar7 + iVar4,decoder_out,&pFVar6->current_width);
  if (!bVar2) {
    local_48.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_48.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pFVar6 = unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>::
             operator->((unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>
                         *)&local_50);
    shared_ptr<void,_true>::operator=
              (&pFVar6->duckdb_fsst_decoder,(shared_ptr<void,_true> *)&local_48);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48.handle.internal.
                super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  pFVar6 = unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>::
           operator->((unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>
                       *)&local_50);
  peVar1 = (pFVar6->duckdb_fsst_decoder).internal.
           super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pFVar6 = unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>::
           operator->((unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>
                       *)&local_50);
  pFVar6->duckdb_fsst_decoder_ptr = peVar1;
  bVar2 = StringStats::HasMaxStringLength(&(segment->stats).statistics);
  if (bVar2) {
    uVar3 = StringStats::MaxStringLength(&(segment->stats).statistics);
    pFVar6 = unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>::
             operator->((unique_ptr<duckdb::FSSTScanState,_std::default_delete<duckdb::FSSTScanState>,_true>
                         *)&local_50);
    pFVar6->all_values_inlined = uVar3 < 0xd;
  }
  *(tuple<duckdb::FSSTScanState_*,_std::default_delete<duckdb::FSSTScanState>_> *)this =
       local_50._M_t.
       super__Tuple_impl<0UL,_duckdb::FSSTScanState_*,_std::default_delete<duckdb::FSSTScanState>_>.
       super__Head_base<0UL,_duckdb::FSSTScanState_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>)
         (unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>)this;
}

Assistant:

unique_ptr<SegmentScanState> FSSTStorage::StringInitScan(ColumnSegment &segment) {
	auto string_block_limit = StringUncompressed::GetStringBlockLimit(segment.GetBlockManager().GetBlockSize());
	auto state = make_uniq<FSSTScanState>(string_block_limit);
	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	state->handle = buffer_manager.Pin(segment.block);
	auto base_ptr = state->handle.Ptr() + segment.GetBlockOffset();

	state->duckdb_fsst_decoder = make_buffer<duckdb_fsst_decoder_t>();
	auto retval = ParseFSSTSegmentHeader(
	    base_ptr, reinterpret_cast<duckdb_fsst_decoder_t *>(state->duckdb_fsst_decoder.get()), &state->current_width);
	if (!retval) {
		state->duckdb_fsst_decoder = nullptr;
	}
	state->duckdb_fsst_decoder_ptr = state->duckdb_fsst_decoder.get();

	if (StringStats::HasMaxStringLength(segment.stats.statistics)) {
		state->all_values_inlined = StringStats::MaxStringLength(segment.stats.statistics) <= string_t::INLINE_LENGTH;
	}

	return std::move(state);
}